

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize_constraint.cpp
# Opt level: O0

bool __thiscall
Clasp::DefaultMinimize::handleUnsat(DefaultMinimize *this,Solver *s,bool up,LitVec *out)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  uint32 uVar4;
  undefined8 in_RCX;
  byte in_DL;
  Solver *in_RSI;
  DefaultMinimize *in_RDI;
  uint32 dl;
  bool more;
  Var in_stack_ffffffffffffff9c;
  Solver *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  undefined8 in_stack_ffffffffffffffb0;
  Literal p;
  uint32 uVar5;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined1 aux;
  undefined4 in_stack_ffffffffffffffd0;
  uint32 uVar6;
  undefined4 in_stack_ffffffffffffffd4;
  uint uVar7;
  uint32 n;
  undefined7 in_stack_ffffffffffffffe0;
  bool local_1;
  
  p.rep_ = (uint32)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
  n = (uint32)((ulong)in_RCX >> 0x20);
  bVar1 = in_DL & 1;
  bVar2 = SharedMinimizeData::optimize((SharedMinimizeData *)in_stack_ffffffffffffffa0);
  bVar3 = false;
  if (bVar2) {
    bVar3 = commitLowerBound((DefaultMinimize *)
                             CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                             (Solver *)
                             (CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8) &
                             0xffffffff00ffffff),SUB81((ulong)in_RDI >> 0x38,0));
  }
  uVar7 = CONCAT13(bVar3,(int3)in_stack_ffffffffffffffd4);
  aux = (undefined1)((in_RDI->super_MinimizeConstraint).tag_.rep_ >> 0x18);
  bVar2 = Solver::isTrue((Solver *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),p);
  if (bVar2) {
    Literal::var(&(in_RDI->super_MinimizeConstraint).tag_);
    uVar5 = Solver::level(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  }
  else {
    uVar5 = 0;
  }
  relaxBound(in_RDI,SUB41(uVar5 >> 0x18,0));
  if ((((uVar7 & 0x1000000) == 0) || (uVar5 == 0)) ||
     (uVar6 = uVar5, uVar4 = Solver::rootLevel(in_RSI), uVar4 < uVar5)) {
    local_1 = false;
  }
  else {
    Solver::rootLevel(in_RSI);
    Solver::popRootLevel
              ((Solver *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),n,(LitVec *)CONCAT44(uVar7,uVar6)
               ,(bool)aux);
    local_1 = Solver::popRootLevel
                        ((Solver *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),n,
                         (LitVec *)CONCAT44(uVar7,uVar6),(bool)aux);
  }
  return local_1;
}

Assistant:

bool DefaultMinimize::handleUnsat(Solver& s, bool up, LitVec& out) {
	bool more = shared_->optimize() && commitLowerBound(s, up);
	uint32 dl = s.isTrue(tag_) ? s.level(tag_.var()) : 0;
	relaxBound(false);
	if (more && dl && dl <= s.rootLevel()) {
		s.popRootLevel(s.rootLevel()-dl, &out); // pop and remember new path
		return s.popRootLevel(1);               // pop tag - disable constraint
	}
	return false;
}